

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::render<unsigned_char>
          (CImgDisplay *this,CImg<unsigned_char> *img,bool flag8)

{
  uint uVar1;
  uchar *puVar2;
  undefined8 uVar3;
  int iVar4;
  X11_static *pXVar5;
  CImgDisplay *pCVar6;
  byte *pbVar7;
  uint *ptrs;
  long lVar8;
  ulong uVar9;
  CImgArgumentException *this_00;
  CImg<unsigned_char> *img_00;
  long lVar10;
  uchar *puVar11;
  uchar *puVar12;
  byte bVar13;
  char *pcVar14;
  uchar *puVar15;
  bool bVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  CImg<unsigned_int> local_50;
  
  if (img->_data == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    bVar16 = this->_title != (char *)0x0;
    uVar3 = 0x5b;
    if (bVar16) {
      uVar3 = 0x22;
    }
    pcVar14 = "untitled";
    if (bVar16) {
      pcVar14 = this->_title;
    }
    uVar20 = 0x5d;
    if (bVar16) {
      uVar20 = 0x22;
    }
    CImgArgumentException::CImgArgumentException
              (this_00,"[instance(%u,%u,%u,%c%s%c)] CImgDisplay::render(): Empty specified image.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_normalization,uVar3,pcVar14);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException,uVar20);
  }
  if (this->_width == 0) {
    return this;
  }
  if (this->_height == 0) {
    return this;
  }
  if (img->_depth != 1) {
    CImg<unsigned_char>::get_projections2d
              ((CImg<unsigned_char> *)&local_50,img,img->_width - 1 >> 1,img->_height - 1 >> 1,
               img->_depth - 1 >> 1);
    pCVar6 = render<unsigned_char>(this,(CImg<unsigned_char> *)&local_50,false);
LAB_0018e2cd:
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&local_50);
    return pCVar6;
  }
  pXVar5 = cimg::X11_attr();
  if (pXVar5->nb_bits == 8) {
    if ((img->_width != this->_width) || (img->_height != this->_height)) {
      CImg<unsigned_char>::get_resize
                ((CImg<unsigned_char> *)&local_50,img,this->_width,this->_height,1,-100,1,0,0.0,0.0,
                 0.0,0.0);
      pCVar6 = render<unsigned_char>(this,(CImg<unsigned_char> *)&local_50,false);
      goto LAB_0018e2cd;
    }
  }
  pXVar5 = cimg::X11_attr();
  uVar17 = img->_spectrum;
  if ((uVar17 == 3 && !flag8) && pXVar5->nb_bits == 8) {
    if ((render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)::default_colormap ==
         '\0') &&
       (iVar4 = __cxa_guard_acquire(&render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)
                                     ::default_colormap), iVar4 != 0)) {
      img_00 = CImg<unsigned_char>::default_LUT256();
      CImg<unsigned_char>::CImg(&render<unsigned_char>::default_colormap,img_00);
      __cxa_atexit(CImg<unsigned_char>::~CImg,&render<unsigned_char>::default_colormap,&__dso_handle
                  );
      __cxa_guard_release(&render<unsigned_char>(cimg_library::CImg<unsigned_char>const&,bool)::
                           default_colormap);
    }
    CImg<unsigned_char>::get_index<unsigned_char>
              (&local_50,img,&render<unsigned_char>::default_colormap,1.0,false);
    pCVar6 = render<unsigned_int>(this,&local_50,false);
    CImg<unsigned_int>::~CImg(&local_50);
    return pCVar6;
  }
  puVar2 = img->_data;
  puVar11 = puVar2;
  puVar15 = puVar2;
  if (1 < uVar17) {
    lVar10 = (ulong)img->_depth * (ulong)img->_height * (ulong)img->_width;
    puVar15 = puVar2 + lVar10;
    if (uVar17 != 2) {
      puVar11 = puVar2 + lVar10 * 2;
    }
  }
  pXVar5 = cimg::X11_attr();
  puVar12 = puVar11;
  if (pXVar5->is_blue_first != false) {
    puVar12 = puVar2;
    puVar2 = puVar11;
  }
  cimg::mutex(0xf,1);
  uVar17 = this->_normalization;
  if ((uVar17 == 3) || (uVar17 == 0)) {
    this->_min = 0.0;
    this->_max = 0.0;
    pXVar5 = cimg::X11_attr();
    if (pXVar5->nb_bits == 0x10) {
      if ((img->_width == this->_width) && (img->_height == this->_height)) {
        ptrs = (uint *)this->_data;
      }
      else {
        lVar10 = (ulong)img->_height * (ulong)img->_width;
        uVar9 = 0xffffffffffffffff;
        if (-1 < lVar10) {
          uVar9 = lVar10 * 2;
        }
        ptrs = (uint *)operator_new__(uVar9);
      }
      uVar17 = img->_spectrum;
      pXVar5 = cimg::X11_attr();
      bVar16 = pXVar5->byte_order;
      lVar10 = (ulong)img->_height * (ulong)img->_width;
      if (uVar17 == 2) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar15[lVar8];
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 * '\b' & 0xe0;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 5 | puVar2[lVar8] & 0xf8;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar15[lVar8];
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 >> 5 | puVar2[lVar8] & 0xf8;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = (bVar13 & 0x1c) << 3;
          }
        }
      }
      else if (uVar17 == 1) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar2[lVar8];
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 * '\b' & 0xe0 | bVar13 >> 3;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 5 | bVar13 & 0xf8;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar2[lVar8];
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 >> 5 | bVar13 & 0xf8;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 3 | bVar13 * '\b' & 0xe0;
          }
        }
      }
      else if (bVar16 == false) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          bVar13 = puVar15[lVar8];
          *(byte *)((long)ptrs + lVar8 * 2) = bVar13 * '\b' & 0xe0 | puVar12[lVar8] >> 3;
          *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 5 | puVar2[lVar8] & 0xf8;
        }
      }
      else {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          bVar13 = puVar15[lVar8];
          *(byte *)((long)ptrs + lVar8 * 2) = bVar13 >> 5 | puVar2[lVar8] & 0xf8;
          *(byte *)((long)ptrs + lVar8 * 2 + 1) = puVar12[lVar8] >> 3 | (bVar13 & 0x1c) << 3;
        }
      }
      goto LAB_0018ee66;
    }
    if (pXVar5->nb_bits != 8) {
      if ((img->_width == this->_width) && (img->_height == this->_height)) {
        ptrs = (uint *)this->_data;
      }
      else {
        uVar9 = (ulong)img->_height * (ulong)img->_width;
        ptrs = (uint *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
      }
      uVar17 = img->_spectrum;
      pXVar5 = cimg::X11_attr();
      bVar16 = pXVar5->byte_order;
      lVar10 = (ulong)img->_height * (ulong)img->_width;
      if (uVar17 == 2) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = (uint)puVar15[lVar8] << 8 | (uint)puVar2[lVar8] << 0x10;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = (uint)puVar2[lVar8] << 8 | (uint)puVar15[lVar8] << 0x10;
          }
        }
      }
      else if (uVar17 == 1) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar2[lVar8];
            ptrs[lVar8] = (uint)bVar13 << 8 | (uint)bVar13 << 0x10 | (uint)bVar13;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = puVar2[lVar8];
            ptrs[lVar8] = (uint)bVar13 << 8 | (uint)bVar13 << 0x10 | (uint)bVar13;
          }
        }
      }
      else if (bVar16 == false) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          ptrs[lVar8] = (uint)puVar12[lVar8] |
                        (uint)puVar15[lVar8] << 8 | (uint)puVar2[lVar8] << 0x10;
        }
      }
      else {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          ptrs[lVar8] = (uint)puVar2[lVar8] << 8 |
                        (uint)puVar15[lVar8] << 0x10 | (uint)puVar12[lVar8] << 0x18;
        }
      }
      goto LAB_0018ef7e;
    }
    _set_colormap(this,&this->_colormap,img->_spectrum);
    uVar17 = img->_width;
    uVar1 = img->_height;
    if ((uVar17 == this->_width) && (uVar1 == this->_height)) {
      ptrs = (uint *)this->_data;
    }
    else {
      ptrs = (uint *)operator_new__((ulong)uVar1 * (ulong)uVar17);
    }
    lVar10 = (ulong)uVar17 * (ulong)uVar1;
    if (img->_spectrum == 1) {
      for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(uchar *)((long)ptrs + lVar8) = puVar2[lVar8];
      }
    }
    else if (img->_spectrum == 2) {
      for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(byte *)((long)ptrs + lVar8) = puVar15[lVar8] >> 4 | puVar2[lVar8] & 0xf0;
      }
    }
    else {
      for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(byte *)((long)ptrs + lVar8) =
             puVar12[lVar8] >> 6 | puVar15[lVar8] >> 3 & 0x1c | puVar2[lVar8] & 0xe0;
      }
    }
LAB_0018eb3a:
    if (ptrs == (uint *)this->_data) goto LAB_0018efae;
    _render_resize<unsigned_char,unsigned_char>
              ((uchar *)ptrs,img->_width,img->_height,(uchar *)this->_data,this->_width,
               this->_height);
  }
  else {
    if (uVar17 == 1) {
LAB_0018e40b:
      pbVar7 = CImg<unsigned_char>::min_max<float>(img,&this->_max);
      fVar19 = (float)*pbVar7;
      this->_min = fVar19;
      fVar18 = this->_max;
    }
    else {
      fVar19 = this->_min;
      fVar18 = this->_max;
      if (fVar18 < fVar19) goto LAB_0018e40b;
    }
    uVar17 = -(uint)(fVar18 - fVar19 != 0.0);
    fVar19 = (float)(~uVar17 & 0x437f0000 | (uint)(255.0 / (fVar18 - fVar19)) & uVar17);
    pXVar5 = cimg::X11_attr();
    if (pXVar5->nb_bits == 0x10) {
      if ((img->_width == this->_width) && (img->_height == this->_height)) {
        ptrs = (uint *)this->_data;
      }
      else {
        lVar10 = (ulong)img->_height * (ulong)img->_width;
        uVar9 = 0xffffffffffffffff;
        if (-1 < lVar10) {
          uVar9 = lVar10 * 2;
        }
        ptrs = (uint *)operator_new__(uVar9);
      }
      uVar17 = img->_spectrum;
      pXVar5 = cimg::X11_attr();
      bVar16 = pXVar5->byte_order;
      lVar10 = (ulong)img->_height * (ulong)img->_width;
      if (uVar17 == 2) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = (byte)(int)(((float)puVar15[lVar8] - this->_min) * fVar19);
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 * '\b' & 0xe0;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) =
                 bVar13 >> 5 | (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19) & 0xf8;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = (byte)(int)(((float)puVar15[lVar8] - this->_min) * fVar19);
            *(byte *)((long)ptrs + lVar8 * 2) =
                 bVar13 >> 5 | (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19) & 0xf8;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = (bVar13 & 0x1c) << 3;
          }
        }
      }
      else if (uVar17 == 1) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19);
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 * '\b' & 0xe0 | bVar13 >> 3;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 5 | bVar13 & 0xf8;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            bVar13 = (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19);
            *(byte *)((long)ptrs + lVar8 * 2) = bVar13 >> 5 | bVar13 & 0xf8;
            *(byte *)((long)ptrs + lVar8 * 2 + 1) = bVar13 >> 3 | bVar13 * '\b' & 0xe0;
          }
        }
      }
      else if (bVar16 == false) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          bVar13 = (byte)(int)(((float)puVar15[lVar8] - this->_min) * fVar19);
          *(byte *)((long)ptrs + lVar8 * 2) =
               bVar13 * '\b' & 0xe0 |
               (byte)(int)(((float)puVar12[lVar8] - this->_min) * fVar19) >> 3;
          *(byte *)((long)ptrs + lVar8 * 2 + 1) =
               bVar13 >> 5 | (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19) & 0xf8;
        }
      }
      else {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          bVar13 = (byte)(int)(((float)puVar15[lVar8] - this->_min) * fVar19);
          *(byte *)((long)ptrs + lVar8 * 2) =
               bVar13 >> 5 | (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19) & 0xf8;
          *(byte *)((long)ptrs + lVar8 * 2 + 1) =
               (byte)(int)(((float)puVar12[lVar8] - this->_min) * fVar19) >> 3 |
               (bVar13 & 0x1c) << 3;
        }
      }
LAB_0018ee66:
      if (ptrs == (uint *)this->_data) goto LAB_0018efae;
      _render_resize<unsigned_short,unsigned_short>
                ((unsigned_short *)ptrs,img->_width,img->_height,(unsigned_short *)this->_data,
                 this->_width,this->_height);
    }
    else {
      if (pXVar5->nb_bits == 8) {
        _set_colormap(this,&this->_colormap,img->_spectrum);
        uVar17 = img->_width;
        uVar1 = img->_height;
        if ((uVar17 == this->_width) && (uVar1 == this->_height)) {
          ptrs = (uint *)this->_data;
        }
        else {
          ptrs = (uint *)operator_new__((ulong)uVar1 * (ulong)uVar17);
        }
        lVar10 = (ulong)uVar17 * (ulong)uVar1;
        if (img->_spectrum == 1) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            *(uchar *)((long)ptrs + lVar8) =
                 (uchar)(int)(((float)puVar2[lVar8] - this->_min) * fVar19);
          }
        }
        else if (img->_spectrum == 2) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            *(byte *)((long)ptrs + lVar8) =
                 (byte)(int)(((float)puVar15[lVar8] - this->_min) * fVar19) >> 4 |
                 (byte)(int)(((float)puVar2[lVar8] - this->_min) * fVar19) & 0xf0;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            fVar18 = this->_min;
            *(byte *)((long)ptrs + lVar8) =
                 (byte)(int)(((float)puVar12[lVar8] - fVar18) * fVar19) >> 6 |
                 (byte)(int)(((float)puVar15[lVar8] - fVar18) * fVar19) >> 3 & 0x1c |
                 (byte)(int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xe0;
          }
        }
        goto LAB_0018eb3a;
      }
      if ((img->_width == this->_width) && (img->_height == this->_height)) {
        ptrs = (uint *)this->_data;
      }
      else {
        uVar9 = (ulong)img->_height * (ulong)img->_width;
        ptrs = (uint *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
      }
      uVar17 = img->_spectrum;
      pXVar5 = cimg::X11_attr();
      bVar16 = pXVar5->byte_order;
      lVar10 = (ulong)img->_height * (ulong)img->_width;
      fVar18 = this->_min;
      if (uVar17 == 2) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = ((int)(((float)puVar15[lVar8] - fVar18) * fVar19) & 0xffU) << 8 |
                          ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) << 0x10;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) << 8 |
                          ((int)(((float)puVar15[lVar8] - fVar18) * fVar19) & 0xffU) << 0x10;
          }
        }
      }
      else if (uVar17 == 1) {
        if (bVar16 == false) {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) * 0x10101;
          }
        }
        else {
          for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
            ptrs[lVar8] = ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) * 0x1010100;
          }
        }
      }
      else if (bVar16 == false) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          ptrs[lVar8] = (int)(((float)puVar12[lVar8] - fVar18) * fVar19) & 0xffU |
                        ((int)(((float)puVar15[lVar8] - fVar18) * fVar19) & 0xffU) << 8 |
                        ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) << 0x10;
        }
      }
      else {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          ptrs[lVar8] = ((int)(((float)puVar2[lVar8] - fVar18) * fVar19) & 0xffU) << 8 |
                        ((int)(((float)puVar15[lVar8] - fVar18) * fVar19) & 0xffU) << 0x10 |
                        (int)(((float)puVar12[lVar8] - fVar18) * fVar19) << 0x18;
        }
      }
LAB_0018ef7e:
      if (ptrs == (uint *)this->_data) goto LAB_0018efae;
      _render_resize<unsigned_int,unsigned_int>
                (ptrs,img->_width,img->_height,(uint *)this->_data,this->_width,this->_height);
    }
  }
  if (ptrs != (uint *)0x0) {
    operator_delete__(ptrs);
  }
LAB_0018efae:
  cimg::mutex(0xf,0);
  return this;
}

Assistant:

CImgDisplay& render(const CImg<T>& img, const bool flag8=false) {
      if (!img)
        throw CImgArgumentException(_cimgdisplay_instance
                                    "render(): Empty specified image.",
                                    cimgdisplay_instance);
      if (is_empty()) return *this;
      if (img._depth!=1) return render(img.get_projections2d((img._width - 1)/2,(img._height - 1)/2,
                                                             (img._depth - 1)/2));
      if (cimg::X11_attr().nb_bits==8 && (img._width!=_width || img._height!=_height))
        return render(img.get_resize(_width,_height,1,-100,1));
      if (cimg::X11_attr().nb_bits==8 && !flag8 && img._spectrum==3) {
        static const CImg<typename CImg<T>::ucharT> default_colormap = CImg<typename CImg<T>::ucharT>::default_LUT256();
        return render(img.get_index(default_colormap,1,false));
      }

      const T
        *data1 = img._data,
        *data2 = (img._spectrum>1)?img.data(0,0,0,1):data1,
        *data3 = (img._spectrum>2)?img.data(0,0,0,2):data1;

      if (cimg::X11_attr().is_blue_first) cimg::swap(data1,data3);
      cimg_lock_display();

      if (!_normalization || (_normalization==3 && cimg::type<T>::string()==cimg::type<unsigned char>::string())) {
        _min = _max = 0;
        switch (cimg::X11_attr().nb_bits) {
        case 8 : { // 256 colormap, no normalization
          _set_colormap(_colormap,img._spectrum);
          unsigned char
            *const ndata = (img._width==_width && img._height==_height)?(unsigned char*)_data:
            new unsigned char[(size_t)img._width*img._height],
            *ptrd = (unsigned char*)ndata;
          switch (img._spectrum) {
          case 1 :
            for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
              (*ptrd++) = (unsigned char)*(data1++);
            break;
          case 2 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
	      const unsigned char
                R = (unsigned char)*(data1++),
                G = (unsigned char)*(data2++);
	      (*ptrd++) = (R&0xf0) | (G>>4);
	    } break;
          default : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
	      const unsigned char
                R = (unsigned char)*(data1++),
                G = (unsigned char)*(data2++),
                B = (unsigned char)*(data3++);
	      (*ptrd++) = (R&0xe0) | ((G>>5)<<2) | (B>>6);
	    }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned char*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        case 16 : { // 16 bits colors, no normalization
          unsigned short *const ndata = (img._width==_width && img._height==_height)?(unsigned short*)_data:
            new unsigned short[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          const unsigned int M = 248;
          switch (img._spectrum) {
          case 1 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)*(data1++), G = val>>2;
                ptrd[0] = (val&M) | (G>>3);
                ptrd[1] = (G<<5) | (G>>1);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)*(data1++), G = val>>2;
                ptrd[0] = (G<<5) | (G>>1);
                ptrd[1] = (val&M) | (G>>3);
                ptrd+=2;
              }
            break;
          case 2 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd[1] = (G<<5);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = (G<<5);
                ptrd[1] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd+=2;
              }
            break;
          default :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd[1] = (G<<5) | ((unsigned char)*(data3++)>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)*(data2++)>>2;
                ptrd[0] = (G<<5) | ((unsigned char)*(data3++)>>3);
                ptrd[1] = ((unsigned char)*(data1++)&M) | (G>>3);
                ptrd+=2;
              }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned short*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        default : { // 24 bits colors, no normalization
          unsigned int *const ndata = (img._width==_width && img._height==_height)?(unsigned int*)_data:
            new unsigned int[(size_t)img._width*img._height];
          if (sizeof(int)==4) { // 32 bits int uses optimized version
            unsigned int *ptrd = ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)*(data1++);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                 const unsigned char val = (unsigned char)*(data1++);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data1++)<<16) | ((unsigned char)*(data2++)<<8);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data2++)<<16) | ((unsigned char)*(data1++)<<8);
              break;
            default :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data1++)<<16) | ((unsigned char)*(data2++)<<8) |
                    (unsigned char)*(data3++);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) = ((unsigned char)*(data3++)<<24) | ((unsigned char)*(data2++)<<16) |
                    ((unsigned char)*(data1++)<<8);
            }
          } else {
            unsigned char *ptrd = (unsigned char*)ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)*(data1++);
                  ptrd[2] = 0;
                  ptrd[3] = 0;
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = 0;
                  ptrd[2] = (unsigned char)*(data1++);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order) cimg::swap(data1,data2);
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                ptrd[0] = 0;
                ptrd[1] = (unsigned char)*(data2++);
                ptrd[2] = (unsigned char)*(data1++);
                ptrd[3] = 0;
                ptrd+=4;
              }
              break;
            default :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)*(data1++);
                  ptrd[2] = (unsigned char)*(data2++);
                  ptrd[3] = (unsigned char)*(data3++);
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = (unsigned char)*(data3++);
                  ptrd[1] = (unsigned char)*(data2++);
                  ptrd[2] = (unsigned char)*(data1++);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned int*)_data,_width,_height);
            delete[] ndata;
          }
        }
        }
      } else {
        if (_normalization==3) {
          if (cimg::type<T>::is_float()) _min = (float)img.min_max(_max);
          else { _min = (float)cimg::type<T>::min(); _max = (float)cimg::type<T>::max(); }
        } else if ((_min>_max) || _normalization==1) _min = (float)img.min_max(_max);
        const float delta = _max - _min, mm = 255/(delta?delta:1.f);
        switch (cimg::X11_attr().nb_bits) {
        case 8 : { // 256 colormap, with normalization
          _set_colormap(_colormap,img._spectrum);
          unsigned char *const ndata = (img._width==_width && img._height==_height)?(unsigned char*)_data:
            new unsigned char[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          switch (img._spectrum) {
          case 1 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char R = (unsigned char)((*(data1++) - _min)*mm);
              *(ptrd++) = R;
            } break;
          case 2 : for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char
                R = (unsigned char)((*(data1++) - _min)*mm),
                G = (unsigned char)((*(data2++) - _min)*mm);
            (*ptrd++) = (R&0xf0) | (G>>4);
          } break;
          default :
            for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
              const unsigned char
                R = (unsigned char)((*(data1++) - _min)*mm),
                G = (unsigned char)((*(data2++) - _min)*mm),
                B = (unsigned char)((*(data3++) - _min)*mm);
              *(ptrd++) = (R&0xe0) | ((G>>5)<<2) | (B>>6);
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned char*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        case 16 : { // 16 bits colors, with normalization
          unsigned short *const ndata = (img._width==_width && img._height==_height)?(unsigned short*)_data:
            new unsigned short[(size_t)img._width*img._height];
          unsigned char *ptrd = (unsigned char*)ndata;
          const unsigned int M = 248;
          switch (img._spectrum) {
          case 1 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)((*(data1++) - _min)*mm), G = val>>2;
                ptrd[0] = (val&M) | (G>>3);
                ptrd[1] = (G<<5) | (val>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char val = (unsigned char)((*(data1++) - _min)*mm), G = val>>2;
                ptrd[0] = (G<<5) | (val>>3);
                ptrd[1] = (val&M) | (G>>3);
                ptrd+=2;
              }
            break;
          case 2 :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd[1] = (G<<5);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = (G<<5);
                ptrd[1] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd+=2;
              }
            break;
          default :
            if (cimg::X11_attr().byte_order)
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd[1] = (G<<5) | ((unsigned char)((*(data3++) - _min)*mm)>>3);
                ptrd+=2;
              } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                const unsigned char G = (unsigned char)((*(data2++) - _min)*mm)>>2;
                ptrd[0] = (G<<5) | ((unsigned char)((*(data3++) - _min)*mm)>>3);
                ptrd[1] = ((unsigned char)((*(data1++) - _min)*mm)&M) | (G>>3);
                ptrd+=2;
              }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned short*)_data,_width,_height);
            delete[] ndata;
          }
        } break;
        default : { // 24 bits colors, with normalization
          unsigned int *const ndata = (img._width==_width && img._height==_height)?(unsigned int*)_data:
            new unsigned int[(size_t)img._width*img._height];
          if (sizeof(int)==4) { // 32 bits int uses optimized version
            unsigned int *ptrd = ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  *(ptrd++) = (val<<16) | (val<<8) | val;
                }
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  *(ptrd++) = (val<<24) | (val<<16) | (val<<8);
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data1++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<8);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data2++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data1++) - _min)*mm)<<8);
              break;
            default :
              if (cimg::X11_attr().byte_order==cimg::endianness())
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data1++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<8) |
                    (unsigned char)((*(data3++) - _min)*mm);
              else
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy)
                  *(ptrd++) =
                    ((unsigned char)((*(data3++) - _min)*mm)<<24) |
                    ((unsigned char)((*(data2++) - _min)*mm)<<16) |
                    ((unsigned char)((*(data1++) - _min)*mm)<<8);
            }
          } else {
            unsigned char *ptrd = (unsigned char*)ndata;
            switch (img._spectrum) {
            case 1 :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[0] = 0;
                  ptrd[1] = val;
                  ptrd[2] = val;
                  ptrd[3] = val;
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  const unsigned char val = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[0] = val;
                  ptrd[1] = val;
                  ptrd[2] = val;
                  ptrd[3] = 0;
                  ptrd+=4;
                }
              break;
            case 2 :
              if (cimg::X11_attr().byte_order) cimg::swap(data1,data2);
              for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                ptrd[0] = 0;
                ptrd[1] = (unsigned char)((*(data2++) - _min)*mm);
                ptrd[2] = (unsigned char)((*(data1++) - _min)*mm);
                ptrd[3] = 0;
                ptrd+=4;
              }
              break;
            default :
              if (cimg::X11_attr().byte_order)
                for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = 0;
                  ptrd[1] = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[2] = (unsigned char)((*(data2++) - _min)*mm);
                  ptrd[3] = (unsigned char)((*(data3++) - _min)*mm);
                  ptrd+=4;
                } else for (cimg_ulong xy = (cimg_ulong)img._width*img._height; xy>0; --xy) {
                  ptrd[0] = (unsigned char)((*(data3++) - _min)*mm);
                  ptrd[1] = (unsigned char)((*(data2++) - _min)*mm);
                  ptrd[2] = (unsigned char)((*(data1++) - _min)*mm);
                  ptrd[3] = 0;
                  ptrd+=4;
                }
            }
          }
          if (ndata!=_data) {
            _render_resize(ndata,img._width,img._height,(unsigned int*)_data,_width,_height);
            delete[] ndata;
          }
	}
        }
      }
      cimg_unlock_display();
      return *this;
    }